

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SourceFile.cpp
# Opt level: O2

void __thiscall hdc::SourceFile::addDef(SourceFile *this,Def *def)

{
  Def *local_18;
  
  local_18 = def;
  std::vector<hdc::Def_*,_std::allocator<hdc::Def_*>_>::push_back(&this->defs,&local_18);
  Def::setFile(local_18,this);
  ASTNode::setParentNode(&local_18->super_ASTNode,&this->super_ASTNode);
  return;
}

Assistant:

void SourceFile::addDef(Def* def) {
    defs.push_back(def);
    def->setFile(this);
    def->setParentNode(this);
}